

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.h
# Opt level: O2

void __thiscall
cnn::LookupParameters::load<boost::archive::text_iarchive>
          (LookupParameters *this,text_iarchive *ar,uint param_2)

{
  uint uVar1;
  undefined8 in_RAX;
  pointer pTVar2;
  pointer pTVar3;
  int nv;
  
  nv = (int)((ulong)in_RAX >> 0x20);
  boost::archive::detail::load_non_pointer_type<boost::archive::text_iarchive>::load_standard::
  invoke<cnn::Dim>(ar,&this->dim);
  boost::archive::basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>::
  load<int>((basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_> *)
            &ar->field_0x28,&nv);
  pTVar2 = (this->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar3 = (this->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (nv == (int)(((long)pTVar2 - (long)pTVar3) / 0x48)) {
    for (uVar1 = 0; (ulong)uVar1 < (ulong)(((long)pTVar2 - (long)pTVar3) / 0x48); uVar1 = uVar1 + 1)
    {
      boost::archive::detail::load_non_pointer_type<boost::archive::text_iarchive>::load_standard::
      invoke<cnn::Tensor>(ar,pTVar3 + uVar1);
      pTVar3 = (this->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
               super__Vector_impl_data._M_start;
      pTVar2 = (this->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    return;
  }
  __assert_fail("nv == (int)values.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/model.h"
                ,0x5c,
                "void cnn::LookupParameters::load(Archive &, const unsigned int) [Archive = boost::archive::text_iarchive]"
               );
}

Assistant:

void load(Archive& ar, const unsigned int) {
    ar & dim;
    int nv;
    ar & nv;
    assert(nv == (int)values.size());
    for (unsigned i = 0; i < values.size(); ++i)
      ar & values[i];
  }